

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void preconditioner_to_regularizer<sparse_parameters>
               (vw *all,bfgs *b,float regularization,sparse_parameters *weights)

{
  bool bVar1;
  uint32_t uVar2;
  float *pfVar3;
  undefined8 uVar4;
  char *pcVar5;
  int __c;
  int __c_00;
  int __c_01;
  sparse_parameters *in_RDX;
  ulong uVar6;
  long in_RSI;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> *p_Var7;
  undefined4 in_XMM0_Da;
  float fVar8;
  iterator iVar9;
  iterator w_2;
  iterator w_1;
  uint64_t i;
  iterator w;
  stringstream __msg;
  uint32_t length;
  sparse_iterator<float> *in_stack_fffffffffffffd08;
  sparse_parameters *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd28;
  int in_stack_fffffffffffffd34;
  char *in_stack_fffffffffffffd38;
  long lVar10;
  vw_exception *in_stack_fffffffffffffd40;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_2a0;
  uint32_t local_298;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_290;
  uint32_t local_288;
  sparse_iterator<float> local_280;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_270;
  uint32_t local_268;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_260;
  uint32_t local_258;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_250;
  uint32_t local_248;
  sparse_iterator<float> local_240;
  ulong local_230;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_228;
  uint32_t local_220;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_218;
  uint32_t local_210;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_208;
  uint32_t local_200;
  sparse_iterator<float> local_1f8;
  undefined1 local_1e1;
  stringstream local_1b0 [16];
  stringstream local_1a0 [120];
  size_t in_stack_fffffffffffffed8;
  
  if (*(long *)(in_RSI + 0xd8) == 0) {
    pfVar3 = calloc_or_throw<float>(in_stack_fffffffffffffed8);
    *(float **)(in_RSI + 0xd8) = pfVar3;
    if (*(long *)(in_RSI + 0xd8) == 0) {
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::operator<<((ostream *)(local_1b0 + 0x10),
                      "Failed to allocate weight array: try decreasing -b <bits>");
      local_1e1 = 1;
      uVar4 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,in_stack_fffffffffffffd34,
                 in_stack_fffffffffffffd28);
      local_1e1 = 0;
      __cxa_throw(uVar4,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    iVar9 = sparse_parameters::begin(in_stack_fffffffffffffd10);
    local_208._M_cur =
         (__node_type *)
         iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_200 = iVar9._stride;
    local_1f8._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_208._M_cur;
    local_1f8._stride = local_200;
    while( true ) {
      iVar9 = sparse_parameters::end(in_stack_fffffffffffffd10);
      local_228._M_cur =
           (__node_type *)
           iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_220 = iVar9._stride;
      p_Var7 = &local_218;
      local_218._M_cur = local_228._M_cur;
      local_210 = local_220;
      bVar1 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffd10,
                         in_stack_fffffffffffffd08);
      if (!bVar1) break;
      pcVar5 = sparse_iterator<float>::index(&local_1f8,(char *)p_Var7,__c);
      uVar2 = sparse_parameters::stride_shift(in_RDX);
      local_230 = (ulong)pcVar5 >> ((byte)uVar2 & 0x3f);
      *(undefined4 *)(*(long *)(in_RSI + 0xd8) + local_230 * 8) = in_XMM0_Da;
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28f1c8);
      if (0.0 < pfVar3[3]) {
        pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28f1e2);
        *(float *)(*(long *)(in_RSI + 0xd8) + local_230 * 8) =
             1.0 / pfVar3[3] + *(float *)(*(long *)(in_RSI + 0xd8) + local_230 * 8);
      }
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffd10);
    }
  }
  else {
    iVar9 = sparse_parameters::begin(in_stack_fffffffffffffd10);
    local_250._M_cur =
         (__node_type *)
         iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_248 = iVar9._stride;
    local_240._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
         = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
           (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_250._M_cur;
    local_240._stride = local_248;
    while( true ) {
      iVar9 = sparse_parameters::end(in_stack_fffffffffffffd10);
      local_270._M_cur =
           (__node_type *)
           iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
           _M_cur;
      local_268 = iVar9._stride;
      p_Var7 = &local_260;
      local_260._M_cur = local_270._M_cur;
      local_258 = local_268;
      bVar1 = sparse_iterator<float>::operator!=
                        ((sparse_iterator<float> *)in_stack_fffffffffffffd10,
                         in_stack_fffffffffffffd08);
      if (!bVar1) break;
      pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28f2cb);
      if (0.0 < pfVar3[3]) {
        pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28f2e5);
        fVar8 = 1.0 / pfVar3[3];
        lVar10 = *(long *)(in_RSI + 0xd8);
        pcVar5 = sparse_iterator<float>::index(&local_240,(char *)p_Var7,__c_00);
        uVar2 = sparse_parameters::stride_shift(in_RDX);
        uVar6 = (ulong)pcVar5 >> ((byte)uVar2 & 0x3f);
        *(float *)(lVar10 + uVar6 * 8) = fVar8 + *(float *)(lVar10 + uVar6 * 8);
      }
      sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffd10);
    }
  }
  iVar9 = sparse_parameters::begin(in_stack_fffffffffffffd10);
  local_290._M_cur =
       (__node_type *)
       iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur;
  local_288 = iVar9._stride;
  local_280._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur =
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
       (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_290._M_cur;
  local_280._stride = local_288;
  while( true ) {
    iVar9 = sparse_parameters::end(in_stack_fffffffffffffd10);
    local_2a0._M_cur =
         (__node_type *)
         iVar9._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>.
         _M_cur;
    local_298 = iVar9._stride;
    p_Var7 = &local_2a0;
    bVar1 = sparse_iterator<float>::operator!=
                      ((sparse_iterator<float> *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd08
                      );
    if (!bVar1) break;
    pfVar3 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x28f3da);
    fVar8 = *pfVar3;
    lVar10 = *(long *)(in_RSI + 0xd8);
    in_stack_fffffffffffffd10 =
         (sparse_parameters *)sparse_iterator<float>::index(&local_280,(char *)p_Var7,__c_01);
    uVar2 = sparse_parameters::stride_shift(in_RDX);
    *(float *)(lVar10 + 4 + ((ulong)in_stack_fffffffffffffd10 >> ((byte)uVar2 & 0x3f)) * 8) = fVar8;
    sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffd10);
  }
  return;
}

Assistant:

void preconditioner_to_regularizer(vw& all, bfgs& b, float regularization, T& weights)
{
  uint32_t length = 1 << all.num_bits;

  if (b.regularizers == nullptr)
  {
    b.regularizers = calloc_or_throw<weight>(2 * length);

    if (b.regularizers == nullptr)
      THROW("Failed to allocate weight array: try decreasing -b <bits>");

    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      uint64_t i = w.index() >> weights.stride_shift();
      b.regularizers[2 * i] = regularization;
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * i] += 1.f / (&(*w))[W_COND];
    }
  }
  else
    for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    {
      if ((&(*w))[W_COND] > 0.f)
        b.regularizers[2 * (w.index() >> weights.stride_shift())] += 1.f / (&(*w))[W_COND];
    }

  for (typename T::iterator w = weights.begin(); w != weights.end(); ++w)
    b.regularizers[2 * (w.index() >> weights.stride_shift()) + 1] = *w;
}